

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

void __thiscall kratos::Stmt::remove_from_parent(Stmt *this)

{
  Generator *this_00;
  IRNode *pIVar1;
  initializer_list<kratos::IRNode_*> __l;
  IRNodeKind IVar2;
  StmtException *this_01;
  shared_ptr<kratos::Stmt> sVar3;
  allocator<kratos::IRNode_*> local_a9;
  Stmt *local_a8;
  Stmt **local_a0;
  size_type local_98;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_90;
  allocator<char> local_71;
  string local_70;
  enable_shared_from_this<kratos::Stmt> local_50;
  IRNode *local_40;
  Stmt *stmt;
  enable_shared_from_this<kratos::Stmt> local_28;
  Generator *local_18;
  Generator *gen;
  Stmt *this_local;
  
  if (this->parent_ != (IRNode *)0x0) {
    gen = (Generator *)this;
    IVar2 = IRNode::ir_node_kind(this->parent_);
    if (IVar2 == GeneratorKind) {
      this_00 = (Generator *)this->parent_;
      local_18 = this_00;
      std::enable_shared_from_this<kratos::Stmt>::shared_from_this(&local_28);
      Generator::remove_stmt(this_00,(shared_ptr<kratos::Stmt> *)&local_28);
      std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)&local_28);
    }
    else {
      IVar2 = IRNode::ir_node_kind(this->parent_);
      if (IVar2 != StmtKind) {
        this_01 = (StmtException *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,"Statement parent is null",&local_71);
        local_a0 = &local_a8;
        local_98 = 1;
        local_a8 = this;
        std::allocator<kratos::IRNode_*>::allocator(&local_a9);
        __l._M_len = local_98;
        __l._M_array = (iterator)local_a0;
        std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                  (&local_90,__l,&local_a9);
        StmtException::StmtException(this_01,&local_70,&local_90);
        __cxa_throw(this_01,&StmtException::typeinfo,StmtException::~StmtException);
      }
      pIVar1 = this->parent_;
      local_40 = pIVar1;
      sVar3 = std::enable_shared_from_this<kratos::Stmt>::shared_from_this(&local_50);
      (*pIVar1->_vptr_IRNode[10])
                (pIVar1,&local_50,
                 sVar3.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi._M_pi);
      std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)&local_50);
    }
  }
  return;
}

Assistant:

void Stmt::remove_from_parent() {
    if (!parent_) return;
    if (parent_->ir_node_kind() == IRNodeKind::GeneratorKind) {
        auto *gen = reinterpret_cast<Generator *>(parent_);
        gen->remove_stmt(shared_from_this());
    } else if (parent_->ir_node_kind() == IRNodeKind::StmtKind) {
        auto *stmt = reinterpret_cast<Stmt *>(parent_);
        stmt->remove_stmt(shared_from_this());
    } else {
        throw StmtException("Statement parent is null", {this});
    }
}